

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::checkQueryTimeouts(CommonCore *this)

{
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  int index;
  deque<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  *this_01;
  bool bVar1;
  _Elt_pointer ppVar2;
  _Elt_pointer ppVar3;
  allocator<char> local_91;
  _Map_pointer local_90;
  deque<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  *local_88;
  long local_80;
  _Elt_pointer local_78;
  string local_70;
  string local_50;
  
  if ((this->queryTimeouts).
      super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->queryTimeouts).
      super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_88 = &this->queryTimeouts;
    local_80 = std::chrono::_V2::steady_clock::now();
    ppVar2 = (this->queryTimeouts).
             super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    ppVar3 = (this->queryTimeouts).
             super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    local_90 = (this->queryTimeouts).
               super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    local_78 = (this->queryTimeouts).
               super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    this_00 = &this->activeQueries;
    while (this_01 = local_88, ppVar2 != local_78) {
      bVar1 = gmlc::concurrency::
              DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::isRecognized(this_00,ppVar2->first);
      if (((bVar1) &&
          (bVar1 = gmlc::concurrency::
                   DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::isCompleted(this_00,ppVar2->first), !bVar1)) &&
         ((this->super_BrokerBase).queryTimeout.internalTimeCode <
          local_80 - (ppVar2->second).__d.__r)) {
        index = ppVar2->first;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"query timeout",&local_91);
        generateJsonErrorResponse(&local_50,GATEWAY_TIMEOUT,&local_70);
        gmlc::concurrency::
        DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::setDelayedValue(this_00,index,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        ppVar2->first = 0;
      }
      ppVar2 = ppVar2 + 1;
      if (ppVar2 == ppVar3) {
        ppVar2 = local_90[1];
        local_90 = local_90 + 1;
        ppVar3 = ppVar2 + 0x20;
      }
    }
    while (ppVar3 = (this->queryTimeouts).
                    super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur,
          (this->queryTimeouts).
          super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar3) {
      if (ppVar3->first != 0) {
        return;
      }
      std::
      deque<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
      ::pop_front(this_01);
    }
    BrokerBase::setTickForwarding(&this->super_BrokerBase,QUERY_TIMEOUT,false);
  }
  return;
}

Assistant:

void CommonCore::unregister()
{
    /*We need to ensure that the destructor is not called immediately upon calling unregister
    otherwise this would be a mess and probably cause segmentation faults so we capture it in a
    local variable that will be destroyed on function exit
    */
    auto keepCoreAlive = CoreFactory::findCore(identifier);
    if (keepCoreAlive) {
        if (keepCoreAlive.get() == this) {
            CoreFactory::unregisterCore(identifier);
        }
    }

    if (!prevIdentifier.empty()) {
        auto keepCoreAlive2 = CoreFactory::findCore(prevIdentifier);
        if (keepCoreAlive2) {
            if (keepCoreAlive2.get() == this) {
                CoreFactory::unregisterCore(prevIdentifier);
            }
        }
    }
}